

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Convert_S32_To_F32_SSE2(int32_t *src,float *dst,uint32_t len)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int in_EDX;
  undefined1 (*in_RSI) [16];
  int *in_RDI;
  undefined1 auVar4 [16];
  __m128i *mmsrc;
  __m128 divby8388607;
  SDL_AssertState sdl_assert_state;
  int i;
  int *local_c0;
  int local_a0;
  undefined1 (*local_98) [16];
  int *local_90;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  local_98 = in_RSI;
  local_90 = in_RDI;
  for (local_a0 = in_EDX; local_a0 != 0 && ((ulong)local_98 & 0xf) != 0; local_a0 = local_a0 + -1) {
    *(float *)*local_98 = (float)(*local_90 >> 8) * 1.192093e-07;
    local_90 = local_90 + 1;
    local_98 = (undefined1 (*) [16])(*local_98 + 4);
  }
  do {
    if (local_a0 == 0 || ((ulong)local_98 & 0xf) == 0) goto LAB_001324af;
    iVar3 = SDL_ReportAssertion(&FAudio_INTERNAL_Convert_S32_To_F32_SSE2::sdl_assert_data,
                                "FAudio_INTERNAL_Convert_S32_To_F32_SSE2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_internal_simd.c"
                                ,0xec);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_001324af:
  if (((ulong)local_90 & 0xf) == 0) {
    local_c0 = local_90;
    for (; 3 < local_a0; local_a0 = local_a0 + -4) {
      local_18 = (int)*(undefined8 *)local_c0;
      iStack_14 = (int)((ulong)*(undefined8 *)local_c0 >> 0x20);
      iStack_10 = (int)*(undefined8 *)(local_c0 + 2);
      iStack_c = (int)((ulong)*(undefined8 *)(local_c0 + 2) >> 0x20);
      auVar4 = ZEXT416(8);
      auVar2._4_4_ = (float)(iStack_14 >> auVar4) * 1.192093e-07;
      auVar2._0_4_ = (float)(local_18 >> auVar4) * 1.192093e-07;
      auVar2._8_4_ = (float)(iStack_10 >> auVar4) * 1.192093e-07;
      auVar2._12_4_ = (float)(iStack_c >> auVar4) * 1.192093e-07;
      *local_98 = auVar2;
      local_c0 = local_c0 + 4;
      local_98 = local_98 + 1;
    }
    local_90 = local_c0;
  }
  for (; local_a0 != 0; local_a0 = local_a0 + -1) {
    *(float *)*local_98 = (float)(*local_90 >> 8) * 1.192093e-07;
    local_90 = local_90 + 1;
    local_98 = (undefined1 (*) [16])(*local_98 + 4);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_S32_To_F32_SSE2(
	const int32_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;

    /* Get dst aligned to 16 bytes */
    for (i = len; i && (((size_t) dst) & 15); --i, ++src, ++dst) {
        *dst = ((float) (*src>>8)) * DIVBY8388607;
    }

    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128 divby8388607 = _mm_set1_ps(DIVBY8388607);
        const __m128i *mmsrc = (const __m128i *) src;
        while (i >= 4) {   /* 4 * sint32 */
            /* shift out lowest bits so int fits in a float32. Small precision loss, but much faster. */
            _mm_store_ps(dst, _mm_mul_ps(_mm_cvtepi32_ps(_mm_srai_epi32(_mm_load_si128(mmsrc), 8)), divby8388607));
            i -= 4; mmsrc++; dst += 4;
        }
        src = (const int32_t *) mmsrc;
    }

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = ((float) (*src>>8)) * DIVBY8388607;
        i--; src++; dst++;
    }
}